

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O0

istream * operator>>(istream *i,Scope *s)

{
  int iVar1;
  ostream *poVar2;
  ulong uVar3;
  Scope *in_RSI;
  istream *in_RDI;
  Index Index;
  char c;
  uint local_18;
  uint3 in_stack_ffffffffffffffec;
  uint i_00;
  char cVar4;
  
  i_00 = (uint)in_stack_ffffffffffffffec;
  std::operator>>(in_RDI,&stack0xffffffffffffffef);
  iVar1 = (int)in_RDI;
  if ((char)(i_00 >> 0x18) != '<') {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "Scope extraction error: expected \'<\', but got \'");
    poVar2 = std::operator<<(poVar2,(char)(i_00 >> 0x18));
    poVar2 = std::operator<<(poVar2,"\' !");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::ios::setstate(iVar1 + (int)*(undefined8 *)(*(long *)in_RDI + -0x18));
  }
  while (uVar3 = std::ios::good(), (uVar3 & 1) != 0) {
    std::istream::operator>>(in_RDI,&local_18);
    uVar3 = std::ios::good();
    if ((uVar3 & 1) != 0) {
      Scope::Insert(in_RSI,i_00);
    }
  }
  std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)in_RDI + -0x18));
  cVar4 = (char)(i_00 >> 0x18);
  std::operator>>(in_RDI,&stack0xffffffffffffffef);
  if (cVar4 != '>') {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "Scope extraction error: expected \'>\', but got \'");
    poVar2 = std::operator<<(poVar2,cVar4);
    poVar2 = std::operator<<(poVar2,"\' !");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::ios::setstate(iVar1 + (int)*(undefined8 *)(*(long *)in_RDI + -0x18));
  }
  return in_RDI;
}

Assistant:

istream& operator>> (istream& i, Scope& s)
{
    char c = 0;
    i >> c;
    if(c != '<')
    {
        cerr << "Scope extraction error: expected '<', but got '"<<c<<"' !" << endl;
        i.setstate(ios_base::failbit);
    }
    while( i.good() )
    {
        Index Index;
        i >> Index;   
#if 0        
        cout << "parsed Index="<<Index;
        cout << ",\ti.good="<<i.good();
        cout << ",\ti.eof="<<i.eof();
        cout << ",\ti.fail="<<i.fail();
        cout << ",\ti.bad="<<i.bad()<<endl;
#endif        
        if(i.good() )
            s.Insert(Index);
    }
    //failed to parse an Index
    i.clear(); //reset status
    i >> c;
    if(c != '>')
    {
        cerr << "Scope extraction error: expected '>', but got '"<<c<<"' !" << endl;
        i.setstate(ios_base::failbit);
    }

    return i;
}